

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void expand_object(tgestate_t *state,object_t index,uint8_t *output)

{
  tgeobject_t *ptVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  
  ptVar1 = interior_object_defs[index];
  bVar7 = ptVar1->width;
  uVar3 = (uint)bVar7;
  uVar4 = (uint)ptVar1->height;
  puVar2 = ptVar1->data;
  iVar5 = state->columns - (uint)bVar7;
  uVar6 = (uint)bVar7;
LAB_00105b2b:
  do {
    uVar8 = (uint)*puVar2;
    if (*puVar2 == 0xff) {
      bVar7 = puVar2[1];
      if (bVar7 != 0xff) {
        if ((char)bVar7 < '\0') {
          uVar8 = bVar7 & 0x7f;
          bVar7 = puVar2[2];
          do {
            if (bVar7 != 0) {
              *output = bVar7;
            }
            output = output + 1;
            uVar6 = uVar6 - 1;
            if (uVar6 == 0) {
              uVar4 = uVar4 - 1;
              if (uVar4 == 0) {
                return;
              }
              output = output + iVar5;
              uVar6 = uVar3;
            }
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        else {
          uVar8 = bVar7 & 0x70;
          if (uVar8 != 0x40) {
            puVar2 = puVar2 + 1;
            goto LAB_00105b5b;
          }
          uVar8 = bVar7 & 0xf;
          bVar7 = puVar2[2];
          do {
            *output = bVar7;
            output = output + 1;
            uVar6 = uVar6 - 1;
            if (uVar6 == 0) {
              uVar4 = uVar4 - 1;
              if (uVar4 == 0) {
                return;
              }
              output = output + iVar5;
              uVar6 = uVar3;
            }
            bVar7 = bVar7 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        puVar2 = puVar2 + 3;
        goto LAB_00105b2b;
      }
      puVar2 = puVar2 + 1;
      bVar7 = 0xff;
LAB_00105b6b:
      *output = bVar7;
    }
    else {
LAB_00105b5b:
      bVar7 = (byte)uVar8;
      if (uVar8 != 0) goto LAB_00105b6b;
    }
    puVar2 = puVar2 + 1;
    output = output + 1;
    uVar6 = uVar6 - 1;
    if (uVar6 == 0) {
      output = output + iVar5;
      uVar4 = uVar4 - 1;
      uVar6 = uVar3;
      if (uVar4 == 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

void expand_object(tgestate_t *state, object_t index, uint8_t *output)
{
  int                columns;       /* new var */
  const tgeobject_t *obj;           /* was HL */
  int                width, height; /* was B, C */
  int                self_width;    /* was $6AE7 */
  const uint8_t     *data;          /* was HL */
  int                byte;          /* was A */
  int                val;           /* was A' */

  assert(state  != NULL);
  assert(index < interiorobject__LIMIT);
  assert(output != NULL); // assert within tilebuf?

  columns     = state->columns; // Conv: Added.

  assert(columns == 24); // did i add this for any particular reason?

  obj         = interior_object_defs[index];

  width       = obj->width;
  height      = obj->height;

  self_width  = width;

  data        = &obj->data[0];

  assert(width  > 0);
  assert(height > 0);

  do
  {
    do
    {
expand:
      assert(width  > 0);
      assert(height > 0);

      byte = *data;
      if (byte == interiortile_ESCAPE)
      {
        byte = *++data;
        if (byte != interiortile_ESCAPE)
        {
          byte &= 0xF0;
          if (byte >= 128)
            goto repetition;
          if (byte == 64)
            goto range;
          assert(0);
        }
      }

      if (byte)
        *output = byte;
      data++;
      output++;
    }
    while (--width);

    width = self_width;
    output += columns - width; /* move to next row */
  }
  while (--height);

  return;


repetition:
  byte = *data++ & 0x7F;
  val = *data;
  do
  {
    if (val > 0)
      *output = val;
    output++;

    if (--width == 0) /* ran out of width */
    {
      width = self_width;
      output += columns - width; /* move to next row */

      // val = *data; // needless reload in C version (required in original)

      if (--height == 0)
        return;
    }
  }
  while (--byte);

  data++;

  goto expand;


range:
  byte = *data++ & 0x0F;
  val = *data;
  do
  {
    *output++ = val++;

    if (--width == 0) /* ran out of width */
    {
      width = self_width;
      output += columns - self_width; /* move to next row */

      if (--height == 0)
        return;
    }
  }
  while (--byte);

  data++;

  goto expand;
}